

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAParseCharGroup(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  bool bVar2;
  int neg;
  xmlRegParserCtxtPtr ctxt_local;
  
  iVar1 = ctxt->neg;
  if (*ctxt->cur == '^') {
    ctxt->cur = ctxt->cur + 1;
    ctxt->neg = (uint)((ctxt->neg != 0 ^ 0xffU) & 1);
    xmlFAParsePosCharGroup(ctxt);
    ctxt->neg = iVar1;
  }
  while( true ) {
    bVar2 = false;
    if (*ctxt->cur != ']') {
      bVar2 = ctxt->error == 0;
    }
    if (!bVar2) break;
    if ((*ctxt->cur == '-') && (ctxt->cur[1] == '[')) {
      ctxt->cur = ctxt->cur + 1;
      ctxt->cur = ctxt->cur + 1;
      ctxt->neg = 2;
      xmlFAParseCharGroup(ctxt);
      ctxt->neg = iVar1;
      if (*ctxt->cur == ']') {
        ctxt->cur = ctxt->cur + 1;
      }
      else {
        ctxt->error = 0x5aa;
        xmlRegexpErrCompile(ctxt,"charClassExpr: \']\' expected");
      }
      return;
    }
    xmlFAParsePosCharGroup(ctxt);
  }
  return;
}

Assistant:

static void
xmlFAParseCharGroup(xmlRegParserCtxtPtr ctxt) {
    int neg = ctxt->neg;

    if (CUR == '^') {
	NEXT;
	ctxt->neg = !ctxt->neg;
	xmlFAParsePosCharGroup(ctxt);
	ctxt->neg = neg;
    }
    while ((CUR != ']') && (ctxt->error == 0)) {
	if ((CUR == '-') && (NXT(1) == '[')) {
	    NEXT;	/* eat the '-' */
	    NEXT;	/* eat the '[' */
	    ctxt->neg = 2;
	    xmlFAParseCharGroup(ctxt);
	    ctxt->neg = neg;
	    if (CUR == ']') {
		NEXT;
	    } else {
		ERROR("charClassExpr: ']' expected");
	    }
	    break;
	} else {
	    xmlFAParsePosCharGroup(ctxt);
	}
    }
}